

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O3

void game_Run(void)

{
  ECommand_t EVar1;
  _Bool _Var2;
  char cVar3;
  int iVar4;
  int iVar5;
  ECommand_t EVar6;
  ECommand_t EVar7;
  uint uVar8;
  int i;
  char *pcVar9;
  int j;
  
  dd_Init();
  ToExit = '\0';
  ActiveCmd = CMD_NONE;
  tbl_Init();
  ctrl_Init();
  dspl_Init();
  EVar6 = ActiveCmd;
joined_r0x00101dfb:
  do {
    ActiveCmd = EVar6;
    if (ToExit != '\0') {
LAB_001020fc:
      dd_Save();
      dspl_Clear();
      return;
    }
    _Var2 = tbl_IsVictory();
    if (_Var2) {
      iVar4 = tbl_GetCurrentScore();
      iVar5 = dd_GetHighScore();
      pcVar9 = "CONGRATULATIONS, YOU HAVE WON!!!";
      if (iVar5 < iVar4) {
        pcVar9 = "CONGRATULATIONS, YOU HAVE WON WITH NEW TOP SCORE!!!";
      }
      dspl_SetMessage(pcVar9);
      dspl_Render(CMD_NONE);
      iVar5 = dd_GetHighScore();
      if (iVar5 < iVar4) {
        dd_SetHighScore(iVar4);
      }
      dd_Save();
      cVar3 = dspl_Victory();
      EVar6 = ctrl_KeyToCmd(cVar3);
      if (EVar6 != CMD_EXIT) {
        ToExit = '\0';
        ActiveCmd = CMD_NONE;
        tbl_Init();
        ctrl_Init();
        dspl_Init();
        pcVar9 = "";
        goto LAB_00101e99;
      }
switchD_00101ee3_caseD_1:
      ToExit = '\x01';
      goto LAB_001020fc;
    }
    dspl_Render(ActiveCmd);
    dspl_SetMessage("");
    cVar3 = input_ReadKey();
    EVar7 = ctrl_KeyToCmd(cVar3);
    switch(EVar7) {
    case CMD_EXIT:
      goto switchD_00101ee3_caseD_1;
    case CMD_RESET:
      ToExit = '\0';
      ActiveCmd = CMD_NONE;
      tbl_Init();
      ctrl_Init();
      dspl_Init();
      EVar6 = ActiveCmd;
      break;
    case CMD_HELP:
      dspl_ShowHelp();
      EVar6 = ActiveCmd;
      break;
    case CMD_SCHEME:
      dspl_ChangeColorScheme();
      EVar6 = ActiveCmd;
      break;
    default:
      if (EVar7 == CMD_HACK) {
        dspl_HackerMode();
        EVar6 = ActiveCmd;
      }
      else {
        if (ActiveCmd == CMD_NONE) goto LAB_00101f51;
        uVar8 = EVar7 - CMD_COLOR0;
        if (3 < uVar8 && ActiveCmd != EVar7) {
          uVar8 = EVar7 - CMD_DESK0;
          if (6 < uVar8) {
            if (EVar7 == CMD_PACK) {
LAB_00101fb0:
              ActiveCmd = CMD_NONE;
              goto LAB_001020df;
            }
            ActiveCmd = CMD_NONE;
            goto LAB_0010208f;
          }
          if (ActiveCmd == CMD_PACK) {
            _Var2 = tbl_MovePackToDesk(uVar8);
          }
          else if (ActiveCmd - CMD_DESK0 < 7) {
            _Var2 = tbl_MoveDeskToDesk(ActiveCmd - CMD_DESK0,uVar8);
          }
          else {
            if (3 < ActiveCmd - CMD_COLOR0) goto LAB_00101fb0;
            _Var2 = tbl_MoveColorsToDesk(ActiveCmd - CMD_COLOR0,uVar8);
          }
          ActiveCmd = CMD_NONE;
          goto LAB_001020d7;
        }
        if (ActiveCmd == CMD_PACK) {
          _Var2 = tbl_MovePackToColors();
        }
        else if (ActiveCmd - CMD_DESK0 < 7) {
          if (3 < uVar8) {
            uVar8 = 0;
          }
          if (EVar7 - CMD_DESK0 < 7) {
            uVar8 = EVar7 - CMD_DESK0;
          }
          _Var2 = tbl_MoveDeskToColors(uVar8);
        }
        else {
          _Var2 = false;
        }
        EVar1 = ActiveCmd;
        ActiveCmd = CMD_NONE;
        EVar6 = ActiveCmd;
        if ((_Var2 == false) && (EVar1 != EVar7)) goto LAB_001020df;
      }
    }
  } while( true );
LAB_00101f51:
  EVar6 = EVar7;
  if (0xb < EVar7 - CMD_PACK) {
    if (EVar7 != CMD_NEXT) {
      if (EVar7 == CMD_LAZY) {
        iVar4 = 0;
        do {
          iVar5 = 0;
          do {
            if (((iVar4 != iVar5) && (_Var2 = tbl_IsRevealingDeskMove(iVar4,iVar5), _Var2)) &&
               (_Var2 = tbl_MoveDeskToDesk(iVar4,iVar5), EVar6 = ActiveCmd, _Var2))
            goto joined_r0x00101dfb;
            iVar5 = iVar5 + 1;
          } while (iVar5 != 7);
          iVar4 = iVar4 + 1;
        } while (iVar4 != 7);
        iVar4 = 0;
        do {
          _Var2 = tbl_MovePackToDesk(iVar4);
          EVar6 = ActiveCmd;
          if (_Var2) goto joined_r0x00101dfb;
          iVar4 = iVar4 + 1;
        } while (iVar4 != 7);
        iVar4 = 0;
        do {
          _Var2 = tbl_MoveDeskToColors(iVar4);
          EVar6 = ActiveCmd;
          if (_Var2) goto joined_r0x00101dfb;
          iVar4 = iVar4 + 1;
        } while (iVar4 != 7);
        _Var2 = tbl_MovePackToColors();
LAB_001020d7:
        EVar6 = ActiveCmd;
        if (_Var2 != false) goto joined_r0x00101dfb;
LAB_001020df:
        pcVar9 = "!! Invalid move";
      }
      else {
LAB_0010208f:
        if (FirstFail == '\0') {
          dspl_SetMessage("!! Invalid key - press H for help");
          FirstFail = '\x01';
          EVar6 = ActiveCmd;
          goto joined_r0x00101dfb;
        }
        pcVar9 = "!! Invalid key";
      }
LAB_00101e99:
      dspl_SetMessage(pcVar9);
      EVar6 = ActiveCmd;
      goto joined_r0x00101dfb;
    }
    tbl_DrawNextCard();
    EVar6 = ActiveCmd;
  }
  goto joined_r0x00101dfb;
}

Assistant:

void game_Run(void)
{
  dd_Init();
  InitNewGame();

  while (!ToExit) {
    ECommand_t cmd;
    if (CheckVictory()) {
      // restart or exit game
      continue;
    }
    dspl_Render(ActiveCmd);
    dspl_SetMessage("");

    cmd = ctrl_KeyToCmd(input_ReadKey());

    if (ControlGame(cmd) || ControlDisplay(cmd) || ControlTable(cmd)) {
      continue;
    } else {
      if (FirstFail) {
        dspl_SetMessage("!! Invalid key - press H for help");
        FirstFail = false;
      } else {
        dspl_SetMessage("!! Invalid key");
      }
    }
  }

  dd_Save();
  dspl_Clear();
}